

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_FontFaceQuartet * __thiscall
ON_Font::FontQuartet(ON_FontFaceQuartet *__return_storage_ptr__,ON_Font *this)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  wchar_t *pwVar7;
  ON_FontFaceQuartet *pOVar8;
  uint uVar9;
  long lVar10;
  ON_wString *pOVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ON_wString OStack_68;
  undefined1 local_60 [28];
  ON_SHA1_Hash local_44;
  
  bVar4 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
  pOVar11 = &this->m_en_windows_logfont_name;
  if (bVar4) {
    pOVar11 = &this->m_loc_windows_logfont_name;
  }
  ON_wString::ON_wString(&OStack_68,pOVar11);
  RichTextFontName((ON_Font *)local_60,this,false);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&OStack_68);
  FontNameHash((ON_SHA1_Hash *)(local_60 + 8),pwVar7,false);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_60);
  FontNameHash(&local_44,pwVar7,false);
  bVar4 = ON_wString::IsNotEmpty(&OStack_68);
  bVar5 = ON_wString::IsNotEmpty((ON_wString *)local_60);
  if (bVar5) {
    bVar5 = ON_wString::IsEmpty(&OStack_68);
    uVar9 = 1;
    if (!bVar5) {
      bVar5 = ::operator!=((ON_SHA1_Hash *)(local_60 + 8),&local_44);
      goto LAB_00484170;
    }
  }
  else {
    bVar5 = false;
LAB_00484170:
    if ((bVar5 | bVar4) != 1) goto LAB_0048425a;
    uVar9 = (uint)bVar5;
  }
  uVar12 = (ulong)!bVar4;
  pOVar11 = &OStack_68 + uVar12;
  uVar13 = (ulong)uVar9;
  lVar10 = 0;
  if (uVar12 <= uVar13) {
    lVar10 = uVar13 - uVar12;
  }
  lVar10 = lVar10 + 1;
  do {
    ON_ManagedFonts::InstalledFonts();
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(pOVar11);
    pOVar8 = ON_FontList::QuartetFromQuartetName
                       (__return_storage_ptr__,&ON_ManagedFonts::List.m_installed_fonts,pwVar7);
    auVar14._0_4_ =
         -(uint)(*(int *)&__return_storage_ptr__->m_italic == 0 &&
                *(int *)&__return_storage_ptr__->m_regular == 0);
    auVar14._4_4_ =
         -(uint)(*(int *)((long)&__return_storage_ptr__->m_italic + 4) == 0 &&
                *(int *)((long)&__return_storage_ptr__->m_regular + 4) == 0);
    auVar14._8_4_ =
         -(uint)(*(int *)&__return_storage_ptr__->m_bold_italic == 0 &&
                *(int *)&__return_storage_ptr__->m_bold == 0);
    auVar14._12_4_ =
         -(uint)(*(int *)((long)&__return_storage_ptr__->m_bold_italic + 4) == 0 &&
                *(int *)((long)&__return_storage_ptr__->m_bold + 4) == 0);
    iVar6 = movmskps((int)pOVar8,auVar14);
    if (iVar6 != 0xf) goto LAB_00484280;
    ON_wString::~ON_wString(&__return_storage_ptr__->m_quartet_name);
    pOVar11 = pOVar11 + 1;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  pOVar11 = &OStack_68 + uVar12;
  lVar10 = 0;
  if (uVar12 <= uVar13) {
    lVar10 = uVar13 - uVar12;
  }
  lVar10 = lVar10 + 1;
  do {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(pOVar11);
    pOVar8 = ON_FontList::QuartetFromQuartetName
                       (__return_storage_ptr__,&ON_ManagedFonts::List.m_managed_fonts,pwVar7);
    auVar15._0_4_ =
         -(uint)(*(int *)&__return_storage_ptr__->m_italic == 0 &&
                *(int *)&__return_storage_ptr__->m_regular == 0);
    auVar15._4_4_ =
         -(uint)(*(int *)((long)&__return_storage_ptr__->m_italic + 4) == 0 &&
                *(int *)((long)&__return_storage_ptr__->m_regular + 4) == 0);
    auVar15._8_4_ =
         -(uint)(*(int *)&__return_storage_ptr__->m_bold_italic == 0 &&
                *(int *)&__return_storage_ptr__->m_bold == 0);
    auVar15._12_4_ =
         -(uint)(*(int *)((long)&__return_storage_ptr__->m_bold_italic + 4) == 0 &&
                *(int *)((long)&__return_storage_ptr__->m_bold + 4) == 0);
    iVar6 = movmskps((int)pOVar8,auVar15);
    if (iVar6 != 0xf) goto LAB_00484280;
    ON_wString::~ON_wString(&__return_storage_ptr__->m_quartet_name);
    pOVar11 = pOVar11 + 1;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
LAB_0048425a:
  ON_wString::ON_wString
            (&__return_storage_ptr__->m_quartet_name,&ON_FontFaceQuartet::Empty.m_quartet_name);
  pOVar3 = ON_FontFaceQuartet::Empty.m_bold_italic;
  pOVar2 = ON_FontFaceQuartet::Empty.m_bold;
  pOVar1 = ON_FontFaceQuartet::Empty.m_regular;
  __return_storage_ptr__->m_italic = ON_FontFaceQuartet::Empty.m_italic;
  __return_storage_ptr__->m_bold_italic = pOVar3;
  __return_storage_ptr__->m_regular = pOVar1;
  __return_storage_ptr__->m_bold = pOVar2;
LAB_00484280:
  lVar10 = 8;
  do {
    ON_wString::~ON_wString((ON_wString *)((long)&OStack_68.m_s + lVar10));
    lVar10 = lVar10 + -8;
  } while (lVar10 != -8);
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_Font::FontQuartet() const
{
  const ON_wString quartet_name[2] = { QuartetName(), this->RichTextFontName() };
  const ON_SHA1_Hash quartet_name_hash[2] = { ON_Font::FontNameHash(quartet_name[0],false), ON_Font::FontNameHash(quartet_name[1],false) };
  
  const int imin = quartet_name[0].IsNotEmpty() ? 0 : 1;
  const int imax = (quartet_name[1].IsNotEmpty() && (quartet_name[0].IsEmpty() || quartet_name_hash[0] != quartet_name_hash[1])) ? 1 : 0;

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet installed_quartet = ON_Font::InstalledFontList().QuartetFromQuartetName(quartet_name[i]);
    if (installed_quartet.IsNotEmpty())
      return installed_quartet;
  }

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet managed_quartet = ON_Font::ManagedFontList().QuartetFromQuartetName(quartet_name[i]);
    if (managed_quartet.IsNotEmpty())
      return managed_quartet;
  }

  return ON_FontFaceQuartet::Empty;
}